

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<signed_char,_std::allocator<signed_char>_> *
clickhouse::SliceVector<signed_char>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          vector<signed_char,_std::allocator<signed_char>_> *vec,size_t begin,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = (long)(vec->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar3;
  uVar2 = uVar1 - begin;
  if (begin <= uVar1 && uVar2 != 0) {
    if (uVar2 < len) {
      len = uVar2;
    }
    pcVar3 = pcVar3 + begin;
    std::vector<signed_char,std::allocator<signed_char>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>>
              ((vector<signed_char,std::allocator<signed_char>> *)__return_storage_ptr__,pcVar3,
               pcVar3 + len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}